

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O2

void fullsize_smooth_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  byte bVar1;
  JSAMPROW pJVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  JDIMENSION output_cols;
  
  output_cols = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  expand_right_edge(input_data + -1,cinfo->max_v_samp_factor + 2,cinfo->image_width,output_cols);
  iVar6 = cinfo->smoothing_factor * -0x200 + 0x10000;
  iVar7 = cinfo->smoothing_factor * 0x40;
  lVar8 = 0;
  while (lVar8 < cinfo->max_v_samp_factor) {
    pJVar2 = output_data[lVar8];
    pbVar3 = input_data[lVar8 + -1];
    pbVar4 = input_data[lVar8];
    pbVar5 = input_data[lVar8 + 1];
    lVar8 = lVar8 + 1;
    bVar1 = *pbVar4;
    iVar11 = (uint)*pbVar5 + (uint)*pbVar3 + (uint)bVar1;
    iVar9 = (uint)pbVar4[1] + (uint)pbVar5[1] + (uint)pbVar3[1];
    *pJVar2 = (JSAMPLE)(iVar7 * ((iVar11 * 2 - (uint)bVar1) + iVar9) + (uint)bVar1 * iVar6 + 0x8000
                       >> 0x10);
    for (lVar12 = 0; output_cols - 2 != (int)lVar12; lVar12 = lVar12 + 1) {
      iVar10 = (uint)pbVar4[lVar12 + 2] + (uint)pbVar5[lVar12 + 2] + (uint)pbVar3[lVar12 + 2];
      pJVar2[lVar12 + 1] =
           (JSAMPLE)((uint)pbVar4[lVar12 + 1] * iVar6 +
                     iVar7 * (((iVar11 + iVar9) - (uint)pbVar4[lVar12 + 1]) + iVar10) + 0x8000 >>
                    0x10);
      iVar11 = iVar9;
      iVar9 = iVar10;
    }
    pJVar2[lVar12 + 1] =
         (JSAMPLE)((uint)pbVar4[lVar12 + 1] * iVar6 +
                   iVar7 * ((iVar11 + iVar9 * 2) - (uint)pbVar4[lVar12 + 1]) + 0x8000 >> 0x10);
  }
  return;
}

Assistant:

METHODDEF(void)
fullsize_smooth_downsample (j_compress_ptr cinfo, jpeg_component_info *compptr,
			    JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow;
  JDIMENSION colctr;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr, above_ptr, below_ptr, outptr;
  INT32 membersum, neighsum, memberscale, neighscale;
  int colsum, lastcolsum, nextcolsum;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data - 1, cinfo->max_v_samp_factor + 2,
		    cinfo->image_width, output_cols);

  /* Each of the eight neighbor pixels contributes a fraction SF to the
   * smoothed pixel, while the main pixel contributes (1-8*SF).  In order
   * to use integer arithmetic, these factors are multiplied by 2^16 = 65536.
   * Also recall that SF = smoothing_factor / 1024.
   */

  memberscale = 65536L - cinfo->smoothing_factor * 512L; /* scaled 1-8*SF */
  neighscale = cinfo->smoothing_factor * 64; /* scaled SF */

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    outptr = output_data[inrow];
    inptr = input_data[inrow];
    above_ptr = input_data[inrow-1];
    below_ptr = input_data[inrow+1];

    /* Special case for first column */
    colsum = GETJSAMPLE(*above_ptr++) + GETJSAMPLE(*below_ptr++) +
	     GETJSAMPLE(*inptr);
    membersum = GETJSAMPLE(*inptr++);
    nextcolsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(*below_ptr) +
		 GETJSAMPLE(*inptr);
    neighsum = colsum + (colsum - membersum) + nextcolsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr++ = (JSAMPLE) ((membersum + 32768) >> 16);
    lastcolsum = colsum; colsum = nextcolsum;

    for (colctr = output_cols - 2; colctr > 0; colctr--) {
      membersum = GETJSAMPLE(*inptr++);
      above_ptr++; below_ptr++;
      nextcolsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(*below_ptr) +
		   GETJSAMPLE(*inptr);
      neighsum = lastcolsum + (colsum - membersum) + nextcolsum;
      membersum = membersum * memberscale + neighsum * neighscale;
      *outptr++ = (JSAMPLE) ((membersum + 32768) >> 16);
      lastcolsum = colsum; colsum = nextcolsum;
    }

    /* Special case for last column */
    membersum = GETJSAMPLE(*inptr);
    neighsum = lastcolsum + (colsum - membersum) + colsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr = (JSAMPLE) ((membersum + 32768) >> 16);

  }
}